

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_coop_mat_fp8_to_fp16
          (Impl *this,SPIRVModule *module,Id *ids,uint32_t id_count)

{
  Id pointee;
  Id returnType;
  initializer_list<unsigned_int> __l;
  bool bVar1;
  Id IVar2;
  Function *pFVar3;
  Block *pBVar4;
  Instruction *pIVar5;
  size_t sVar6;
  value_type local_160;
  Instruction *local_150;
  Instruction *scale;
  Instruction *loaded_result;
  Instruction *cmp;
  Instruction *store;
  Instruction *output_chain;
  Instruction *bitcast;
  Instruction *mask;
  Instruction *shift;
  Instruction *sext;
  Instruction *load;
  Instruction *input_chain;
  Instruction *iter;
  Instruction *phi;
  Block *merge;
  Block *header;
  Instruction *len;
  undefined1 local_c8 [4];
  Id output_id;
  allocator_type local_ad;
  Id local_ac;
  iterator local_a8;
  undefined8 local_a0;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_98;
  Function *local_80;
  Function *func;
  Id local_70;
  Id u8_ptr_type;
  Id bool_type;
  Id uint_type;
  Block *entry;
  Block *current_build_point;
  CoopMatConvOp *ops;
  iterator __end1;
  iterator __begin1;
  Vector<CoopMatConvOp> *__range1;
  Id f16_type;
  Id u8_type;
  uint32_t id_count_local;
  Id *ids_local;
  SPIRVModule *module_local;
  Impl *this_local;
  
  if (id_count == 2) {
    pointee = *ids;
    returnType = ids[1];
    __end1 = std::
             vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
             ::begin(&this->coop_mat_conv_ids);
    ops = (CoopMatConvOp *)
          std::
          vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
          ::end(&this->coop_mat_conv_ids);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp_*,_std::vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>_>
                                       *)&ops), bVar1) {
      current_build_point =
           (Block *)__gnu_cxx::
                    __normal_iterator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp_*,_std::vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>_>
                    ::operator*(&__end1);
      if (((*(Id *)&current_build_point->_vptr_Block == pointee) &&
          (*(Id *)((long)&current_build_point->_vptr_Block + 4) == returnType)) &&
         (*(HelperCall *)
           ((long)&(current_build_point->instructions).
                   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 4) == CoopMatFP8toFP16)) {
        return *(Id *)&(current_build_point->instructions).
                       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      }
      __gnu_cxx::
      __normal_iterator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp_*,_std::vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>_>
      ::operator++(&__end1);
    }
    entry = spv::Builder::getBuildPoint(&this->builder);
    _bool_type = (Block *)0x0;
    u8_ptr_type = spv::Builder::makeUintType(&this->builder,0x20);
    local_70 = spv::Builder::makeBoolType(&this->builder);
    local_ac = spv::Builder::makePointer(&this->builder,StorageClassFunction,pointee);
    local_a8 = &local_ac;
    local_a0 = 1;
    __l._M_len = 1;
    __l._M_array = local_a8;
    func._4_4_ = local_ac;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_98,__l,&local_ad);
    memset(local_c8,0,0x18);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              *)local_c8);
    pFVar3 = spv::Builder::makeFunctionEntry
                       (&this->builder,DecorationMax,returnType,"CoopMatFP8toFP16",&local_98,
                        (Vector<dxil_spv::Vector<Decoration>_> *)local_c8,(Block **)&bool_type);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               *)local_c8);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_98);
    local_80 = pFVar3;
    len._4_4_ = create_variable(this,StorageClassFunction,returnType,"coop_output");
    header = (Block *)spv::Builder::addInstruction
                                (&this->builder,u8_ptr_type,OpCooperativeMatrixLengthKHR);
    sVar6 = (size_t)pointee;
    spv::Instruction::addIdOperand((Instruction *)header,pointee);
    pBVar4 = (Block *)spv::Block::operator_new((Block *)0x78,sVar6);
    IVar2 = spv::Builder::getUniqueId(&this->builder);
    sVar6 = (size_t)IVar2;
    spv::Block::Block(pBVar4,IVar2,local_80);
    merge = pBVar4;
    pBVar4 = (Block *)spv::Block::operator_new((Block *)0x78,sVar6);
    IVar2 = spv::Builder::getUniqueId(&this->builder);
    spv::Block::Block(pBVar4,IVar2,local_80);
    phi = (Instruction *)pBVar4;
    spv::Builder::createBranch(&this->builder,merge);
    spv::Builder::setBuildPoint(&this->builder,merge);
    iter = spv::Builder::addInstruction(&this->builder,u8_ptr_type,OpPhi);
    pIVar5 = spv::Builder::addInstruction(&this->builder,u8_ptr_type,OpIAdd);
    input_chain = pIVar5;
    IVar2 = spv::Instruction::getResultId(iter);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = input_chain;
    IVar2 = spv::Builder::makeUintConstant(&this->builder,1,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = iter;
    IVar2 = spv::Builder::makeUintConstant(&this->builder,0,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = iter;
    IVar2 = spv::Block::getId(_bool_type);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = iter;
    IVar2 = spv::Instruction::getResultId(input_chain);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = iter;
    IVar2 = spv::Block::getId(merge);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeUintType(&this->builder,8);
    IVar2 = spv::Builder::makePointer(&this->builder,StorageClassFunction,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpInBoundsAccessChain);
    load = pIVar5;
    IVar2 = spv::Function::getParamId(local_80,0);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = load;
    IVar2 = spv::Instruction::getResultId(iter);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeUintType(&this->builder,8);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpLoad);
    sext = pIVar5;
    IVar2 = spv::Instruction::getResultId(load);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeIntType(&this->builder,0x10);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpSConvert);
    shift = pIVar5;
    IVar2 = spv::Instruction::getResultId(sext);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeIntType(&this->builder,0x10);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpShiftLeftLogical);
    mask = pIVar5;
    IVar2 = spv::Instruction::getResultId(shift);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = mask;
    IVar2 = spv::Builder::makeInt16Constant(&this->builder,7,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeIntType(&this->builder,0x10);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpBitwiseAnd);
    bitcast = pIVar5;
    IVar2 = spv::Instruction::getResultId(mask);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = bitcast;
    IVar2 = spv::Builder::makeInt16Constant(&this->builder,-0x4001,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeFloatType(&this->builder,0x10);
    pIVar5 = spv::Builder::addInstruction(&this->builder,IVar2,OpBitcast);
    output_chain = pIVar5;
    IVar2 = spv::Instruction::getResultId(bitcast);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Builder::makeFloatType(&this->builder,0x10);
    IVar2 = spv::Builder::makePointer(&this->builder,StorageClassFunction,IVar2);
    store = spv::Builder::addInstruction(&this->builder,IVar2,OpInBoundsAccessChain);
    spv::Instruction::addIdOperand(store,len._4_4_);
    pIVar5 = store;
    IVar2 = spv::Instruction::getResultId(iter);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,OpStore);
    cmp = pIVar5;
    IVar2 = spv::Instruction::getResultId(store);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = cmp;
    IVar2 = spv::Instruction::getResultId(output_chain);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = spv::Builder::addInstruction(&this->builder,local_70,OpULessThan);
    loaded_result = pIVar5;
    IVar2 = spv::Instruction::getResultId(input_chain);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = loaded_result;
    IVar2 = spv::Instruction::getResultId((Instruction *)header);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    spv::Builder::createLoopMerge(&this->builder,(Block *)phi,merge,0);
    IVar2 = spv::Instruction::getResultId(loaded_result);
    spv::Builder::createConditionalBranch(&this->builder,IVar2,merge,(Block *)phi);
    spv::Builder::setBuildPoint(&this->builder,(Block *)phi);
    scale = spv::Builder::addInstruction(&this->builder,returnType,OpLoad);
    spv::Instruction::addIdOperand(scale,len._4_4_);
    pIVar5 = spv::Builder::addInstruction(&this->builder,returnType,OpMatrixTimesScalar);
    local_150 = pIVar5;
    IVar2 = spv::Instruction::getResultId(scale);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = local_150;
    IVar2 = spv::Builder::makeFloat16Constant(&this->builder,0x5c00,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    IVar2 = spv::Instruction::getResultId(local_150);
    spv::Builder::makeReturn(&this->builder,false,IVar2);
    spv::Builder::setBuildPoint(&this->builder,entry);
    local_160.input_type = pointee;
    local_160.output_type = returnType;
    local_160.func_id = spv::Function::getId(local_80);
    local_160.call = CoopMatFP8toFP16;
    std::
    vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
    ::push_back(&this->coop_mat_conv_ids,&local_160);
    this_local._4_4_ = spv::Function::getId(local_80);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

spv::Id SPIRVModule::Impl::build_coop_mat_fp8_to_fp16(SPIRVModule &module, const spv::Id *ids, uint32_t id_count)
{
	if (id_count != 2)
		return 0;

	spv::Id u8_type = ids[0];
	spv::Id f16_type = ids[1];

	for (auto &ops : coop_mat_conv_ids)
		if (ops.input_type == u8_type && ops.output_type == f16_type && ops.call == HelperCall::CoopMatFP8toFP16)
			return ops.func_id;

	auto *current_build_point = builder.getBuildPoint();

	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id bool_type = builder.makeBoolType();

	// RADV workaround. It fails to understand coopmat passed as value.
	spv::Id u8_ptr_type = builder.makePointer(spv::StorageClassFunction, u8_type);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, f16_type,
	                                       "CoopMatFP8toFP16",
	                                       { u8_ptr_type }, {}, &entry);

	spv::Id output_id = create_variable(spv::StorageClassFunction, f16_type, "coop_output");

	auto *len = builder.addInstruction(uint_type, spv::OpCooperativeMatrixLengthKHR);
	len->addIdOperand(u8_type);

	auto *header = new spv::Block(builder.getUniqueId(), *func);
	auto *merge = new spv::Block(builder.getUniqueId(), *func);
	builder.createBranch(header);
	builder.setBuildPoint(header);
	{
		auto *phi = builder.addInstruction(uint_type, spv::OpPhi);
		auto *iter = builder.addInstruction(uint_type, spv::OpIAdd);
		iter->addIdOperand(phi->getResultId());
		iter->addIdOperand(builder.makeUintConstant(1));

		phi->addIdOperand(builder.makeUintConstant(0));
		phi->addIdOperand(entry->getId());
		phi->addIdOperand(iter->getResultId());
		phi->addIdOperand(header->getId());

		auto *input_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassFunction, builder.makeUintType(8)), spv::OpInBoundsAccessChain);
		input_chain->addIdOperand(func->getParamId(0));
		input_chain->addIdOperand(phi->getResultId());

		auto *load = builder.addInstruction(builder.makeUintType(8), spv::OpLoad);
		load->addIdOperand(input_chain->getResultId());

		auto *sext = builder.addInstruction(builder.makeIntType(16), spv::OpSConvert);
		sext->addIdOperand(load->getResultId());

		auto *shift = builder.addInstruction(builder.makeIntType(16), spv::OpShiftLeftLogical);
		shift->addIdOperand(sext->getResultId());
		shift->addIdOperand(builder.makeInt16Constant(7));

		auto *mask = builder.addInstruction(builder.makeIntType(16), spv::OpBitwiseAnd);
		mask->addIdOperand(shift->getResultId());
		mask->addIdOperand(builder.makeInt16Constant(int16_t(0xffff ^ 0x4000)));

		auto *bitcast = builder.addInstruction(builder.makeFloatType(16), spv::OpBitcast);
		bitcast->addIdOperand(mask->getResultId());

		auto *output_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassFunction, builder.makeFloatType(16)), spv::OpInBoundsAccessChain);
		output_chain->addIdOperand(output_id);
		output_chain->addIdOperand(phi->getResultId());
		auto *store = builder.addInstruction(spv::OpStore);
		store->addIdOperand(output_chain->getResultId());
		store->addIdOperand(bitcast->getResultId());

		auto *cmp = builder.addInstruction(bool_type, spv::OpULessThan);
		cmp->addIdOperand(iter->getResultId());
		cmp->addIdOperand(len->getResultId());
		builder.createLoopMerge(merge, header, 0);
		builder.createConditionalBranch(cmp->getResultId(), header, merge);
	}

	builder.setBuildPoint(merge);
	auto *loaded_result = builder.addInstruction(f16_type, spv::OpLoad);
	loaded_result->addIdOperand(output_id);

	// Need post-scale to correctly deal with denorms.
	auto *scale = builder.addInstruction(f16_type, spv::OpMatrixTimesScalar);
	scale->addIdOperand(loaded_result->getResultId());
	scale->addIdOperand(builder.makeFloat16Constant(0x5c00 /* 256.0 */));

	builder.makeReturn(false, scale->getResultId());

	builder.setBuildPoint(current_build_point);
	coop_mat_conv_ids.push_back({ u8_type, f16_type, func->getId(), HelperCall::CoopMatFP8toFP16 });
	return func->getId();
}